

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess-posix.cc
# Opt level: O0

void __thiscall Subprocess::OnPipeReady(Subprocess *this)

{
  ssize_t sVar1;
  int *piVar2;
  char *pcVar3;
  ssize_t len;
  char buf [4096];
  Subprocess *this_local;
  
  sVar1 = read(this->fd_,&len,0x1000);
  if (sVar1 < 1) {
    if (sVar1 < 0) {
      piVar2 = __errno_location();
      pcVar3 = strerror(*piVar2);
      Fatal("read: %s",pcVar3);
    }
    close(this->fd_);
    this->fd_ = -1;
  }
  else {
    std::__cxx11::string::append((char *)this,(ulong)&len);
  }
  return;
}

Assistant:

void Subprocess::OnPipeReady() {
  char buf[4 << 10];
  ssize_t len = read(fd_, buf, sizeof(buf));
  if (len > 0) {
    buf_.append(buf, len);
  } else {
    if (len < 0)
      Fatal("read: %s", strerror(errno));
    close(fd_);
    fd_ = -1;
  }
}